

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O3

void __thiscall
jsonnet::internal::anon_unknown_0::HeapClosure::HeapClosure
          (HeapClosure *this,BindingFrame *up_values,HeapObject *self,uint offset,Params *params,
          AST *body,string *builtin_name)

{
  pointer pPVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Param *__cur;
  pointer pPVar6;
  pointer pPVar7;
  long lVar8;
  
  (this->super_HeapEntity).type = CLOSURE;
  (this->super_HeapEntity)._vptr_HeapEntity = (_func_int **)&PTR__HeapClosure_0029b740;
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::map(&this->upValues,up_values);
  this->self = self;
  this->offset = offset;
  lVar8 = (long)(params->
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(params->
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                )._M_impl.super__Vector_impl_data._M_start;
  (this->params).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->params).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->params).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar6 = std::
           _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
           ::_M_allocate((_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                          *)(lVar8 >> 4),(size_t)up_values);
  (this->params).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ._M_impl.super__Vector_impl_data._M_start = pPVar6;
  (this->params).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPVar6;
  (this->params).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar8 + (long)pPVar6);
  pPVar1 = (params->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar7 = (params->
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
                )._M_impl.super__Vector_impl_data._M_start; pPVar7 != pPVar1; pPVar7 = pPVar7 + 1) {
    uVar3 = *(undefined4 *)((long)&pPVar7->id + 4);
    uVar4 = *(undefined4 *)&pPVar7->def;
    uVar5 = *(undefined4 *)((long)&pPVar7->def + 4);
    *(undefined4 *)&pPVar6->id = *(undefined4 *)&pPVar7->id;
    *(undefined4 *)((long)&pPVar6->id + 4) = uVar3;
    *(undefined4 *)&pPVar6->def = uVar4;
    *(undefined4 *)((long)&pPVar6->def + 4) = uVar5;
    pPVar6 = pPVar6 + 1;
  }
  (this->params).
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPVar6;
  this->body = body;
  (this->builtinName)._M_dataplus._M_p = (pointer)&(this->builtinName).field_2;
  pcVar2 = (builtin_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->builtinName,pcVar2,pcVar2 + builtin_name->_M_string_length);
  return;
}

Assistant:

HeapClosure(const BindingFrame &up_values, HeapObject *self, unsigned offset,
                const Params &params, const AST *body, const std::string &builtin_name)
        : HeapEntity(CLOSURE),
          upValues(up_values),
          self(self),
          offset(offset),
          params(params),
          body(body),
          builtinName(builtin_name)
    {
    }